

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks,unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *visit_cache)

{
  bool bVar1;
  const_iterator cVar2;
  SmallVector<unsigned_int,_8UL> *pSVar3;
  size_type sVar4;
  uint *succ;
  uint *__k;
  long lVar5;
  bool bVar6;
  uint32_t local_34;
  
  local_34 = block;
  cVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&blocks->_M_h,&local_34);
  if (cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    pSVar3 = diligent_spirv_cross::CFG::get_succeeding_edges(cfg,local_34);
    if ((pSVar3->super_VectorView<unsigned_int>).buffer_size == 0) {
      bVar6 = true;
    }
    else {
      pSVar3 = diligent_spirv_cross::CFG::get_succeeding_edges(cfg,local_34);
      __k = (pSVar3->super_VectorView<unsigned_int>).ptr;
      for (lVar5 = (pSVar3->super_VectorView<unsigned_int>).buffer_size << 2; bVar6 = lVar5 != 0,
          bVar6; lVar5 = lVar5 + -4) {
        sVar4 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&visit_cache->_M_h,__k);
        if (sVar4 == 0) {
          bVar1 = exists_unaccessed_path_to_return(cfg,*__k,blocks,visit_cache);
          if (bVar1) {
            return bVar6;
          }
          std::__detail::
          _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)visit_cache,__k);
        }
        __k = __k + 1;
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks,
                                             unordered_set<uint32_t> &visit_cache)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
	{
		if (visit_cache.count(succ) == 0)
		{
			if (exists_unaccessed_path_to_return(cfg, succ, blocks, visit_cache))
				return true;
			visit_cache.insert(succ);
		}
	}

	return false;
}